

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::multiply_zero_padded(bool add_to,tensor *dest,tensor *src1,tensor *src2)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  int iVar13;
  undefined4 extraout_var;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float *pfVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar13 = (*dest->_vptr_tensor[3])(dest);
  pfVar14 = (float *)CONCAT44(extraout_var,iVar13);
  iVar13 = (*src1->_vptr_tensor[2])(src1);
  lVar15 = CONCAT44(extraout_var_00,iVar13);
  iVar13 = (*src2->_vptr_tensor[2])(src2);
  lVar16 = CONCAT44(extraout_var_01,iVar13);
  bVar12 = have_same_dimensions(dest,src1);
  if ((bVar12) && (bVar12 = have_same_dimensions(dest,src2), bVar12)) {
    lVar1 = dest->m_size;
    lVar17 = 0;
    if (add_to) {
      for (; lVar1 != lVar17; lVar17 = lVar17 + 1) {
        auVar23 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar16 + lVar17 * 4)),
                                  ZEXT416(*(uint *)(lVar15 + lVar17 * 4)),
                                  ZEXT416((uint)pfVar14[lVar17]));
        pfVar14[lVar17] = auVar23._0_4_;
      }
      return;
    }
    for (; lVar1 != lVar17; lVar17 = lVar17 + 1) {
      pfVar14[lVar17] = *(float *)(lVar15 + lVar17 * 4) * *(float *)(lVar16 + lVar17 * 4);
    }
    return;
  }
  uVar2 = dest->m_k;
  uVar3 = dest->m_n;
  for (uVar21 = 0; uVar21 != (~((long)uVar3 >> 0x3f) & uVar3); uVar21 = uVar21 + 1) {
    uVar4 = dest->m_nr;
    for (uVar20 = 0; uVar20 != (~((long)uVar2 >> 0x3f) & uVar2); uVar20 = uVar20 + 1) {
      uVar5 = dest->m_nc;
      for (uVar19 = 0; uVar19 != (~((long)uVar4 >> 0x3f) & uVar4); uVar19 = uVar19 + 1) {
        lVar1 = src1->m_n;
        lVar17 = src1->m_k;
        lVar6 = src1->m_nr;
        lVar7 = src2->m_k;
        lVar8 = src2->m_n;
        lVar9 = src2->m_nr;
        lVar10 = src1->m_nc;
        lVar11 = src2->m_nc;
        for (uVar18 = 0; (~((long)uVar5 >> 0x3f) & uVar5) != uVar18; uVar18 = uVar18 + 1) {
          auVar23 = ZEXT816(0) << 0x40;
          auVar24 = ZEXT816(0) << 0x40;
          if ((long)uVar18 < lVar10 &&
              (((long)uVar20 < lVar17 && (long)uVar21 < lVar1) && (long)uVar19 < lVar6)) {
            auVar24 = ZEXT416(*(uint *)(lVar15 + ((lVar17 * uVar21 + uVar20) * lVar6 + uVar19) *
                                                 lVar10 * 4 + uVar18 * 4));
          }
          if ((long)uVar18 < lVar11 &&
              (((long)uVar20 < lVar7 && (long)uVar21 < lVar8) && (long)uVar19 < lVar9)) {
            auVar23 = ZEXT416(*(uint *)(lVar16 + ((lVar7 * uVar21 + uVar20) * lVar9 + uVar19) *
                                                 lVar11 * 4 + uVar18 * 4));
          }
          if (add_to) {
            auVar23 = vfmadd213ss_fma(auVar23,auVar24,ZEXT416((uint)*pfVar14));
            fVar22 = auVar23._0_4_;
          }
          else {
            fVar22 = auVar24._0_4_ * auVar23._0_4_;
          }
          *pfVar14 = fVar22;
          pfVar14 = pfVar14 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void multiply_zero_padded (
            bool add_to,
            tensor& dest,
            const tensor& src1,
            const tensor& src2
        )
        {
            auto d = dest.host();
            auto s1 = src1.host();
            auto s2 = src2.host();

            // Do the simple and fast version if everything has the same dimensions
            if (have_same_dimensions(dest, src1) &&
                have_same_dimensions(dest, src2))
            {
                if (add_to)
                {
                    for (size_t i = 0; i < dest.size(); ++i)
                        d[i] += s1[i] * s2[i];
                }
                else
                {
                    for (size_t i = 0; i < dest.size(); ++i)
                        d[i] = s1[i] * s2[i];
                }
                return;
            }

            // Otherwise, do the more complex version with bounds checking.
            for (long n = 0; n < dest.num_samples(); ++n)
            {
                for (long k = 0; k < dest.k(); ++k)
                {
                    for (long r = 0; r < dest.nr(); ++r)
                    {
                        for (long c = 0; c < dest.nc(); ++c)
                        {
                            float v1 = 0;
                            float v2 = 0;

                            // if this index is inside src1
                            if (n < src1.num_samples() && 
                                k < src1.k() && 
                                r < src1.nr() && 
                                c < src1.nc() )
                            {
                                const auto s_idx = ((n*src1.k() + k)*src1.nr() + r)*src1.nc() + c;
                                v1 = s1[s_idx];
                            }

                            // if this index is inside src2
                            if (n < src2.num_samples() && 
                                k < src2.k() && 
                                r < src2.nr() && 
                                c < src2.nc() )
                            {
                                const auto s_idx = ((n*src2.k() + k)*src2.nr() + r)*src2.nc() + c;
                                v2 = s2[s_idx];
                            }

                            if (add_to)
                                *d += v1 * v2;
                            else
                                *d = v1 * v2;
                            ++d;
                        }
                    }
                }
            }
        }